

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::FieldOptions::_InternalParse(FieldOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  byte *pbVar5;
  Rep *pRVar6;
  UninterpretedOption *msg;
  ulong uVar7;
  char cVar8;
  uint32 uVar9;
  uint tag;
  int iVar10;
  uint uVar11;
  UnknownFieldSet *this_01;
  uint uVar12;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  pair<const_char_*,_bool> pVar15;
  
  this_00 = &this->_internal_metadata_;
  uVar12 = 0;
LAB_00173b99:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00173fd2;
      pVar15 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar15.first;
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00173fd2;
    }
    bVar1 = *ptr;
    pVar13.second._0_1_ = bVar1;
    pVar13.first = (char *)((byte *)ptr + 1);
    pVar13._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar9 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar13 = internal::ReadTagFallback(ptr,uVar9);
        if (pVar13.first == (char *)0x0) goto LAB_00173fe5;
      }
      else {
        pVar13.second = uVar9;
        pVar13.first = (char *)((byte *)ptr + 2);
        pVar13._12_4_ = 0;
      }
    }
    ptr = pVar13.first;
    tag = pVar13.second;
    uVar11 = (uint)(pVar13._8_8_ >> 3) & 0x1fffffff;
    cVar8 = (char)pVar13.second;
    switch(uVar11) {
    case 1:
      if (cVar8 == '\b') {
        bVar1 = *ptr;
        pVar14.second = (long)(char)bVar1;
        pVar14.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar9 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            if (pVar14.first == (char *)0x0) goto LAB_00173fe5;
          }
          else {
            pVar14.second._0_4_ = uVar9;
            pVar14.first = (char *)((byte *)ptr + 2);
            pVar14.second._4_4_ = 0;
          }
        }
        ptr = pVar14.first;
        if ((uint)pVar14.second < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          this->ctype_ = (uint)pVar14.second;
        }
        else {
          pvVar4 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar4 & 1) == 0) {
            this_01 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            this_01 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          iVar10 = 1;
LAB_00173fa2:
          ptr = pVar14.first;
          UnknownFieldSet::AddVarint(this_01,iVar10,pVar14.second);
        }
        goto LAB_00173b99;
      }
      break;
    case 2:
      if (cVar8 != '\x10') break;
      uVar12 = uVar12 | 2;
      uVar7 = (ulong)*ptr;
      pbVar5 = (byte *)ptr + 1;
      if ((long)uVar7 < 0) {
        bVar1 = ((byte *)ptr)[1];
        uVar11 = ((uint)bVar1 * 0x80 + (uint)(byte)*ptr) - 0x80;
        if (-1 < (char)bVar1) {
          uVar7 = (ulong)uVar11;
          pbVar5 = (byte *)ptr + 2;
          goto LAB_00173df8;
        }
        pVar14 = internal::VarintParseSlow64(ptr,uVar11);
        ptr = pVar14.first;
        this->packed_ = pVar14.second != 0;
        goto LAB_00173e94;
      }
LAB_00173df8:
      ptr = (char *)pbVar5;
      this->packed_ = uVar7 != 0;
      goto LAB_00173b99;
    case 3:
      if (cVar8 == '\x18') {
        uVar12 = uVar12 | 8;
        uVar7 = (ulong)*ptr;
        pbVar5 = (byte *)ptr + 1;
        if ((long)uVar7 < 0) {
          bVar1 = ((byte *)ptr)[1];
          uVar11 = ((uint)bVar1 * 0x80 + (uint)(byte)*ptr) - 0x80;
          if ((char)bVar1 < '\0') {
            pVar14 = internal::VarintParseSlow64(ptr,uVar11);
            ptr = pVar14.first;
            this->deprecated_ = pVar14.second != 0;
            goto LAB_00173e94;
          }
          uVar7 = (ulong)uVar11;
          pbVar5 = (byte *)ptr + 2;
        }
        ptr = (char *)pbVar5;
        this->deprecated_ = uVar7 != 0;
        goto LAB_00173b99;
      }
      break;
    case 4:
    case 7:
    case 8:
    case 9:
      break;
    case 5:
      if (cVar8 == '(') {
        uVar12 = uVar12 | 4;
        uVar7 = (ulong)*ptr;
        pbVar5 = (byte *)ptr + 1;
        if ((long)uVar7 < 0) {
          bVar1 = ((byte *)ptr)[1];
          uVar11 = ((uint)bVar1 * 0x80 + (uint)(byte)*ptr) - 0x80;
          if ((char)bVar1 < '\0') {
            pVar14 = internal::VarintParseSlow64(ptr,uVar11);
            ptr = pVar14.first;
            this->lazy_ = pVar14.second != 0;
            goto LAB_00173e94;
          }
          uVar7 = (ulong)uVar11;
          pbVar5 = (byte *)ptr + 2;
        }
        ptr = (char *)pbVar5;
        this->lazy_ = uVar7 != 0;
        goto LAB_00173b99;
      }
      break;
    case 6:
      if (cVar8 == '0') {
        bVar1 = *ptr;
        pVar14.second = (long)(char)bVar1;
        pVar14.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar9 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            if (pVar14.first == (char *)0x0) goto LAB_00173fe5;
          }
          else {
            pVar14.second._0_4_ = uVar9;
            pVar14.first = (char *)((byte *)ptr + 2);
            pVar14.second._4_4_ = 0;
          }
        }
        ptr = pVar14.first;
        if (2 < (uint)pVar14.second) {
          pvVar4 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar4 & 1) == 0) {
            this_01 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            this_01 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          iVar10 = 6;
          goto LAB_00173fa2;
        }
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        this->jstype_ = (uint)pVar14.second;
        goto LAB_00173b99;
      }
      break;
    case 10:
      if (cVar8 == 'P') {
        uVar12 = uVar12 | 0x10;
        uVar7 = (ulong)*ptr;
        pbVar5 = (byte *)ptr + 1;
        if ((long)uVar7 < 0) {
          bVar1 = ((byte *)ptr)[1];
          uVar11 = ((uint)bVar1 * 0x80 + (uint)(byte)*ptr) - 0x80;
          if ((char)bVar1 < '\0') {
            pVar14 = internal::VarintParseSlow64(ptr,uVar11);
            ptr = pVar14.first;
            this->weak_ = pVar14.second != 0;
            goto LAB_00173e94;
          }
          uVar7 = (ulong)uVar11;
          pbVar5 = (byte *)ptr + 2;
        }
        ptr = (char *)pbVar5;
        this->weak_ = uVar7 != 0;
        goto LAB_00173b99;
      }
      break;
    default:
      if ((uVar11 == 999) && (cVar8 == ':')) {
        ptr = (char *)((byte *)ptr + -2);
        do {
          pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_00173c5c:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar6->allocated_size;
LAB_00173c6e:
            pRVar6->allocated_size = iVar10 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
            pRVar6->elements[iVar10] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar6->allocated_size;
            if (iVar10 <= iVar3) {
              if (iVar10 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00173c5c;
              goto LAB_00173c6e;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) goto LAB_00173fe5;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        goto LAB_00173b99;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      goto LAB_00173fd2;
    }
    if (tag < 8000) {
      ptr = internal::UnknownFieldParse(tag,this_00,ptr,ctx);
    }
    else {
      ptr = internal::ExtensionSet::ParseField
                      (&this->_extensions_,pVar13._8_8_ & 0xffffffff,ptr,
                       (Message *)_FieldOptions_default_instance_,this_00,ctx);
    }
LAB_00173e94:
    if ((byte *)ptr == (byte *)0x0) {
LAB_00173fe5:
      ptr = (char *)0x0;
LAB_00173fd2:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar12;
      return ptr;
    }
  } while( true );
}

Assistant:

const char* FieldOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_CType_IsValid(val))) {
            _internal_set_ctype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_CType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(1, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool packed = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_packed(&has_bits);
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool lazy = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_lazy(&has_bits);
          lazy_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_JSType_IsValid(val))) {
            _internal_set_jstype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_JSType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool weak = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_weak(&has_bits);
          weak_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}